

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static-var-tests.cpp
# Opt level: O2

int countLinesInFile(char *fileName)

{
  istream *piVar1;
  int iVar2;
  string line;
  ifstream file;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&file,fileName,_S_in);
  iVar2 = 0;
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&file,(string *)&line);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    iVar2 = iVar2 + 1;
  }
  std::ifstream::~ifstream(&file);
  std::__cxx11::string::~string((string *)&line);
  return iVar2;
}

Assistant:

int countLinesInFile(const char* fileName) {
    int numberOfLines = 0;
    std::string line;
    std::ifstream file(fileName);

    while (std::getline(file, line))
        ++numberOfLines;
    
    return numberOfLines;
}